

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::GLContext
          (GLContext *this,RenderContext *context,TestLog *log,deUint32 logFlags,IVec4 *baseViewport
          )

{
  glViewportFunc p_Var1;
  ContextType type;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  undefined4 extraout_var;
  CallLogWrapper *this_00;
  Functions *gl;
  IVec4 *baseViewport_local;
  deUint32 logFlags_local;
  TestLog *log_local;
  RenderContext *context_local;
  GLContext *this_local;
  
  type.super_ApiType.m_bits = (ApiType)(*context->_vptr_RenderContext[2])();
  Context::Context(&this->super_Context,type);
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__GLContext_011e6e68;
  this->m_context = context;
  this->m_log = log;
  this->m_logFlags = logFlags;
  tcu::Vector<int,_4>::Vector(&this->m_baseViewport,baseViewport);
  piVar6 = tcu::Vector<int,_4>::z(&this->m_baseViewport);
  iVar2 = *piVar6;
  piVar6 = tcu::Vector<int,_4>::w(&this->m_baseViewport);
  tcu::Vector<int,_4>::Vector(&this->m_curViewport,0,0,iVar2,*piVar6);
  piVar6 = tcu::Vector<int,_4>::z(&this->m_baseViewport);
  iVar2 = *piVar6;
  piVar6 = tcu::Vector<int,_4>::w(&this->m_baseViewport);
  tcu::Vector<int,_4>::Vector(&this->m_curScissor,0,0,iVar2,*piVar6);
  this->m_readFramebufferBinding = 0;
  this->m_drawFramebufferBinding = 0;
  this->m_wrapper = (CallLogWrapper *)0x0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->m_allocatedTextures);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->m_allocatedFbos);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->m_allocatedRbos);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->m_allocatedBuffers);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->m_allocatedVaos);
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::vector
            (&this->m_programs);
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  this_00 = (CallLogWrapper *)operator_new(0x18);
  glu::CallLogWrapper::CallLogWrapper(this_00,(Functions *)CONCAT44(extraout_var,iVar2),log);
  this->m_wrapper = this_00;
  glu::CallLogWrapper::enableLogging(this->m_wrapper,(bool)((byte)logFlags & 1));
  p_Var1 = ((Functions *)CONCAT44(extraout_var,iVar2))->viewport;
  iVar2 = tcu::Vector<int,_4>::x(baseViewport);
  iVar3 = tcu::Vector<int,_4>::y(baseViewport);
  iVar4 = tcu::Vector<int,_4>::z(baseViewport);
  iVar5 = tcu::Vector<int,_4>::w(baseViewport);
  (*p_Var1)(iVar2,iVar3,iVar4,iVar5);
  return;
}

Assistant:

GLContext::GLContext (const glu::RenderContext& context, tcu::TestLog& log, deUint32 logFlags, const tcu::IVec4& baseViewport)
	: Context					(context.getType())
	, m_context					(context)
	, m_log						(log)
	, m_logFlags				(logFlags)
	, m_baseViewport			(baseViewport)
	, m_curViewport				(0, 0, m_baseViewport.z(), m_baseViewport.w())
	, m_curScissor				(0, 0, m_baseViewport.z(), m_baseViewport.w())
	, m_readFramebufferBinding	(0)
	, m_drawFramebufferBinding	(0)
	, m_wrapper					(DE_NULL)
{
	const glw::Functions& gl = m_context.getFunctions();

	// Logging?
	m_wrapper = new glu::CallLogWrapper(gl, log);
	m_wrapper->enableLogging((logFlags & GLCONTEXT_LOG_CALLS) != 0);

	// Setup base viewport. This offset is active when default framebuffer is active.
	// \note Calls related to setting up base viewport are not included in log.
	gl.viewport(baseViewport.x(), baseViewport.y(), baseViewport.z(), baseViewport.w());
}